

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmMove0<(moira::Instr)71,(moira::Mode)9,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  Syntax SVar1;
  int iVar2;
  char cVar3;
  char *pcVar4;
  long lVar5;
  Ea<(moira::Mode)9,_2> src;
  u32 local_24;
  ushort local_20;
  uint local_1c;
  
  local_20 = op & 7;
  local_24 = *addr;
  *addr = local_24 + 2;
  local_1c = (*this->_vptr_Moira[6])();
  local_1c = local_1c & 0xffff;
  cVar3 = 'm';
  lVar5 = 0;
  do {
    pcVar4 = str->ptr;
    str->ptr = pcVar4 + 1;
    *pcVar4 = cVar3;
    cVar3 = "fdmove"[lVar5 + 3];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  pcVar4 = str->ptr;
  SVar1 = str->style->syntax;
  str->ptr = pcVar4 + 1;
  if (2 < SVar1 - MOIRA_MIT) {
    *pcVar4 = '.';
    pcVar4 = str->ptr;
    str->ptr = pcVar4 + 1;
  }
  *pcVar4 = 'w';
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    pcVar4 = str->ptr;
    str->ptr = pcVar4 + 1;
    *pcVar4 = ' ';
  }
  else {
    iVar2 = (str->tab).raw;
    pcVar4 = str->ptr;
    do {
      str->ptr = pcVar4 + 1;
      *pcVar4 = ' ';
      pcVar4 = str->ptr;
    } while (pcVar4 < str->base + iVar2);
  }
  StrWriter::operator<<(str,(Ea<(moira::Mode)9,_2> *)&local_24);
  pcVar4 = str->ptr;
  str->ptr = pcVar4 + 1;
  *pcVar4 = ',';
  SVar1 = str->style->syntax;
  if ((SVar1 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar1 & 0x1f) & 1) != 0)) {
    pcVar4 = str->ptr;
    str->ptr = pcVar4 + 1;
    *pcVar4 = ' ';
  }
  StrWriter::operator<<(str,(Dn)(op >> 9 & 7));
  return;
}

Assistant:

void
Moira::dasmMove0(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = Op <M,S> ( _____________xxx(op), addr );
    auto dst = Dn       ( ____xxx_________(op)       );

    str << Ins<I>{} << Sz<S>{} << str.tab << src << Sep{} << dst;
}